

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretOptionsImpl
          (OptionInterpreter *this,OptionsToInterpret *options_to_interpret,bool skip_extensions)

{
  Message *this_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  bool bVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 extraout_AL;
  int iVar4;
  int iVar5;
  uint uVar6;
  FieldDescriptor *pFVar7;
  MessageLite *pMVar8;
  UninterpretedOption *pUVar9;
  MessageLite *lhs;
  OptionsToInterpret **ppOVar10;
  OptionsToInterpret **extraout_RAX;
  OptionsToInterpret **extraout_RAX_00;
  undefined7 in_register_00000011;
  Metadata MVar11;
  string_view name;
  string_view name_00;
  string_view data;
  string_view element_name;
  string_view str;
  string_view str_00;
  Message *options;
  string buf;
  vector<int,_std::allocator<int>_> src_path;
  MessageLite *local_b8;
  MessageLite *local_b0;
  string local_a8;
  vector<int,_std::allocator<int>_> local_88;
  undefined4 local_6c;
  OptionsToInterpret **local_68;
  OptionsToInterpret *local_60;
  vector<int,_std::allocator<int>_> *local_58;
  VoidPtr local_50;
  code *pcStack_48;
  MessageLite **local_40;
  MessageLite **local_38;
  
  local_6c = (undefined4)CONCAT71(in_register_00000011,skip_extensions);
  pMVar8 = &options_to_interpret->options->super_MessageLite;
  this_00 = options_to_interpret->original_options;
  this->options_to_interpret_ = options_to_interpret;
  local_b8 = pMVar8;
  MVar11 = Message::GetMetadata((Message *)pMVar8);
  name._M_str = "uninterpreted_option";
  name._M_len = 0x14;
  pFVar7 = Descriptor::FindFieldByName(MVar11.descriptor,name);
  if (pFVar7 == (FieldDescriptor *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x249d,"uninterpreted_options_field != nullptr");
    str._M_str = "No field named \"uninterpreted_option\" in the Options proto.";
    str._M_len = 0x3b;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)&local_a8,str);
LAB_00ef7511:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_a8);
  }
  MVar11 = Message::GetMetadata((Message *)pMVar8);
  Reflection::ClearField(MVar11.reflection,(Message *)pMVar8,pFVar7);
  local_58 = &options_to_interpret->element_path;
  local_60 = options_to_interpret;
  std::vector<int,_std::allocator<int>_>::vector(&local_88,local_58);
  local_a8._M_dataplus._M_p._0_4_ = pFVar7->number_;
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_88,
               (iterator)
               local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_a8);
  }
  else {
    *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = pFVar7->number_;
    local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish + 1;
  }
  MVar11 = Message::GetMetadata(this_00);
  name_00._M_str = "uninterpreted_option";
  name_00._M_len = 0x14;
  pFVar7 = Descriptor::FindFieldByName(MVar11.descriptor,name_00);
  if (pFVar7 == (FieldDescriptor *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x24a8,"original_uninterpreted_options_field != nullptr");
    str_00._M_str = "No field named \"uninterpreted_option\" in the Options proto.";
    str_00._M_len = 0x3b;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)&local_a8,str_00);
    goto LAB_00ef7511;
  }
  MVar11 = Message::GetMetadata(this_00);
  iVar4 = Reflection::FieldSize(MVar11.reflection,this_00,pFVar7);
  local_68 = &this->options_to_interpret_;
  local_a8._M_dataplus._M_p = local_a8._M_dataplus._M_p & 0xffffffff00000000;
  pMVar8 = local_b8;
  if (0 < iVar4) {
    iVar5 = 0;
    bVar2 = local_6c._0_1_;
    do {
      if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_88,
                   (iterator)
                   local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_a8);
      }
      else {
        *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = iVar5;
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      MVar11 = Message::GetMetadata(this_00);
      pMVar8 = &Reflection::GetRepeatedMessage
                          (MVar11.reflection,this_00,pFVar7,(int)local_a8._M_dataplus._M_p)->
                super_MessageLite;
      pUVar9 = DownCastMessage<google::protobuf::UninterpretedOption>(pMVar8);
      pMVar8 = local_b8;
      this->uninterpreted_option_ = pUVar9;
      bVar1 = InterpretSingleOption(this,(Message *)local_b8,&local_88,local_58,bVar2);
      if (!bVar1) {
        *local_68 = (OptionsToInterpret *)0x0;
        local_68[1] = (OptionsToInterpret *)0x0;
        ppOVar10 = local_68;
        goto LAB_00ef7419;
      }
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      iVar5 = (int)local_a8._M_dataplus._M_p + 1;
      local_a8._M_dataplus._M_p._0_4_ = iVar5;
    } while (iVar5 < iVar4);
  }
  *local_68 = (OptionsToInterpret *)0x0;
  local_68[1] = (OptionsToInterpret *)0x0;
  lhs = MessageLite::New(pMVar8,(Arena *)0x0);
  local_b0 = lhs;
  MVar11 = Message::GetMetadata((Message *)pMVar8);
  Reflection::Swap(MVar11.reflection,(Message *)lhs,(Message *)pMVar8);
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  bVar2 = MessageLite::AppendToString(local_b0,&local_a8);
  if (bVar2) {
    data._M_str = local_a8._M_dataplus._M_p;
    data._M_len = local_a8._M_string_length;
    bVar2 = MessageLite::ParseFromString(local_b8,data);
    ppOVar10 = (OptionsToInterpret **)(ulong)bVar2;
    if (bVar2) goto LAB_00ef73e5;
  }
  local_40 = &local_b0;
  local_50.obj = &local_40;
  local_38 = &local_b8;
  pcStack_48 = absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretOptionsImpl(google::protobuf::(anonymous_namespace)::OptionsToInterpret*,bool)::__0,std::__cxx11::string>
  ;
  make_error.invoker_ =
       absl::lts_20250127::functional_internal::
       InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretOptionsImpl(google::protobuf::(anonymous_namespace)::OptionsToInterpret*,bool)::__0,std::__cxx11::string>
  ;
  make_error.ptr_.obj = local_50.obj;
  element_name._M_str = (local_60->element_name)._M_dataplus._M_p;
  element_name._M_len = (local_60->element_name)._M_string_length;
  AddError(this->builder_,element_name,this_00,OTHER,make_error);
  MVar11 = Message::GetMetadata((Message *)local_b8);
  Reflection::Swap(MVar11.reflection,(Message *)local_b0,(Message *)local_b8);
  ppOVar10 = extraout_RAX;
LAB_00ef73e5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
    ppOVar10 = extraout_RAX_00;
  }
  if (local_b0 != (MessageLite *)0x0) {
    uVar6 = (*local_b0->_vptr_MessageLite[1])();
    ppOVar10 = (OptionsToInterpret **)(ulong)uVar6;
  }
LAB_00ef7419:
  uVar3 = SUB81(ppOVar10,0);
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    uVar3 = extraout_AL;
  }
  return (bool)uVar3;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::InterpretOptionsImpl(
    OptionsToInterpret* options_to_interpret, bool skip_extensions) {
  // Note that these may be in different pools, so we can't use the same
  // descriptor and reflection objects on both.
  Message* options = options_to_interpret->options;
  const Message* original_options = options_to_interpret->original_options;

  bool failed = false;
  options_to_interpret_ = options_to_interpret;

  // Find the uninterpreted_option field in the mutable copy of the options
  // and clear them, since we're about to interpret them.
  const FieldDescriptor* uninterpreted_options_field =
      options->GetDescriptor()->FindFieldByName("uninterpreted_option");
  ABSL_CHECK(uninterpreted_options_field != nullptr)
      << "No field named \"uninterpreted_option\" in the Options proto.";
  options->GetReflection()->ClearField(options, uninterpreted_options_field);

  std::vector<int> src_path = options_to_interpret->element_path;
  src_path.push_back(uninterpreted_options_field->number());

  // Find the uninterpreted_option field in the original options.
  const FieldDescriptor* original_uninterpreted_options_field =
      original_options->GetDescriptor()->FindFieldByName(
          "uninterpreted_option");
  ABSL_CHECK(original_uninterpreted_options_field != nullptr)
      << "No field named \"uninterpreted_option\" in the Options proto.";

  const int num_uninterpreted_options =
      original_options->GetReflection()->FieldSize(
          *original_options, original_uninterpreted_options_field);
  for (int i = 0; i < num_uninterpreted_options; ++i) {
    src_path.push_back(i);
    uninterpreted_option_ = DownCastMessage<UninterpretedOption>(
        &original_options->GetReflection()->GetRepeatedMessage(
            *original_options, original_uninterpreted_options_field, i));
    if (!InterpretSingleOption(options, src_path,
                               options_to_interpret->element_path,
                               skip_extensions)) {
      // Error already added by InterpretSingleOption().
      failed = true;
      break;
    }
    src_path.pop_back();
  }
  // Reset these, so we don't have any dangling pointers.
  uninterpreted_option_ = nullptr;
  options_to_interpret_ = nullptr;

  if (!failed) {
    // InterpretSingleOption() added the interpreted options in the
    // UnknownFieldSet, in case the option isn't yet known to us.  Now we
    // serialize the options message and deserialize it back.  That way, any
    // option fields that we do happen to know about will get moved from the
    // UnknownFieldSet into the real fields, and thus be available right away.
    // If they are not known, that's OK too. They will get reparsed into the
    // UnknownFieldSet and wait there until the message is parsed by something
    // that does know about the options.

    // Keep the unparsed options around in case the reparsing fails.
    std::unique_ptr<Message> unparsed_options(options->New());
    options->GetReflection()->Swap(unparsed_options.get(), options);

    std::string buf;
    if (!unparsed_options->AppendToString(&buf) ||
        !options->ParseFromString(buf)) {
      builder_->AddError(
          options_to_interpret->element_name, *original_options,
          DescriptorPool::ErrorCollector::OTHER, [&] {
            return absl::StrCat(
                "Some options could not be correctly parsed using the proto "
                "descriptors compiled into this binary.\n"
                "Unparsed options: ",
                unparsed_options->ShortDebugString(),
                "\n"
                "Parsing attempt:  ",
                options->ShortDebugString());
          });
      // Restore the unparsed options.
      options->GetReflection()->Swap(unparsed_options.get(), options);
    }
  }

  return !failed;
}